

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O2

int pt_evt_fetch_event(pt_event_decoder *decoder)

{
  byte *pbVar1;
  pt_packet *packet_00;
  anon_union_16_19_41f219a3_for_payload *packet_01;
  pt_event_queue *evq;
  uint8_t *packet_02;
  pt_time *time_00;
  pt_time_cal *tcal_00;
  pt_last_ip *last_ip;
  byte bVar2;
  pt_event_type pVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  pt_packet *ppVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  uint32_t uVar10;
  undefined7 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int iVar14;
  pt_exec_mode pVar15;
  int iVar16;
  pt_ip_compression pVar17;
  int iVar18;
  pt_event *ppVar19;
  pt_event *ppVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  pt_packet_mode pVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  uint32_t uVar28;
  pt_event *ppVar29;
  pt_event *ppVar30;
  pt_packet_decoder *ppVar31;
  pt_packet_decoder *ppVar32;
  anon_union_32_33_0b3fe036_for_variant *paVar33;
  ulong uVar34;
  uint uVar35;
  uint8_t uVar36;
  bool bVar37;
  byte bVar38;
  long lStack_2b0;
  pt_packet packet;
  pt_time_cal tcal_1;
  pt_time time;
  pt_time_cal tcal;
  pt_packet local_170;
  pt_packet_decoder decoder_1;
  
  bVar38 = 0;
  packet_00 = &decoder->packet;
  packet_01 = &(decoder->packet).payload;
  evq = &decoder->evq;
  packet_02 = &(decoder->packet).payload.cfe.vector;
  time_00 = &decoder->time;
  tcal_00 = &decoder->tcal;
  last_ip = &decoder->ip;
LAB_00105103:
  iVar14 = 1;
  iVar18 = -6;
  switch(packet_00->type) {
  case ppt_invalid:
    if (decoder->status < 0) {
      return decoder->status;
    }
  case ppt_unknown:
  case ppt_pad:
    break;
  case ppt_psb:
    goto switchD_0010512d_caseD_3;
  case ppt_psbend:
    iVar18 = pt_evt_decode_psbend(decoder);
    goto LAB_001063a1;
  case ppt_fup:
switchD_0010512d_caseD_5:
    iVar18 = pt_last_ip_update_ip(last_ip,&packet_01->ip,(pt_config *)decoder);
    if (iVar18 < 0) {
      return iVar18;
    }
    iVar18 = pt_evq_pending(evq,8);
    if (iVar18 != 0) {
      if (iVar18 < 0) {
        return iVar18;
      }
      decoder->field_0x72c = decoder->field_0x72c | 0x20;
    }
    ppVar19 = pt_evq_dequeue(evq,0xc);
    if (ppVar19 != (pt_event *)0x0) {
      decoder->event = ppVar19;
      switch(ppVar19->type) {
      case ptev_overflow:
        uVar35 = pt_evt_event_ip(&(ppVar19->variant).disabled.ip,ppVar19,last_ip);
        decoder->field_0x72c = decoder->field_0x72c | 0x10;
        goto LAB_00106767;
      case ptev_exec_mode:
      case ptev_iflags:
      case ptev_uintr:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        paVar33 = (anon_union_32_33_0b3fe036_for_variant *)&(ppVar19->variant).async_disabled.ip;
        break;
      case ptev_tsx:
      case ptev_exstop:
      case ptev_mwait:
      case ptev_ptwrite:
      case ptev_iret:
      case ptev_smi:
      case ptev_init:
      case ptev_vmentry:
      case ptev_shutdown:
      case ptev_uiret:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        paVar33 = &ppVar19->variant;
        break;
      default:
        goto switchD_0010696d_caseD_4;
      case ptev_tick:
        goto switchD_0010527c_caseD_11;
      case ptev_interrupt:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        paVar33 = (anon_union_32_33_0b3fe036_for_variant *)&(ppVar19->variant).async_paging.ip;
        break;
      case ptev_rsm:
      case ptev_sipi:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        if ((ppVar19->field_0x4 & 1) != 0) {
          return 0;
        }
        return -1;
      case ptev_vmexit:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        paVar33 = (anon_union_32_33_0b3fe036_for_variant *)&(ppVar19->variant).vmexit.ip;
      }
      uVar35 = pt_evt_event_ip(&(paVar33->disabled).ip,ppVar19,last_ip);
LAB_00106767:
      return (int)uVar35 >> 0x1f & uVar35;
    }
    iVar18 = iVar14;
    if (((decoder->field_0x72c & 0x20) == 0) &&
       (iVar18 = pt_last_ip_query((uint64_t *)&decoder_1,last_ip), -1 < iVar18)) {
      ppVar19 = pt_evq_enqueue(evq,2);
      if (ppVar19 == (pt_event *)0x0) {
LAB_00106442:
        iVar18 = -9;
      }
      else {
        ppVar19->type = ptev_async_branch;
        (ppVar19->variant).enabled.ip = decoder_1.config.size;
        iVar18 = iVar14;
      }
    }
    goto LAB_001063a1;
  case ppt_tip:
switchD_0010512d_caseD_6:
    if ((decoder->field_0x72c & 0x10) == 0) {
      return -6;
    }
    iVar14 = pt_last_ip_update_ip(last_ip,&packet_01->ip,(pt_config *)decoder);
    if (iVar14 < 0) {
      return iVar14;
    }
    if ((decoder->field_0x72c & 0x20) == 0) {
      decoder->field_0x72c = decoder->field_0x72c | 0x20;
      ppVar20 = pt_evq_find(evq,2,ptev_async_branch);
      if (ppVar20 == (pt_event *)0x0) {
        ppVar19 = pt_evq_standalone(evq);
        decoder->event = ppVar19;
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_tip;
        paVar33 = &ppVar19->variant;
      }
      else {
        ppVar19 = pt_evq_dequeue(evq,2);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        if (ppVar19 != ppVar20) {
          ppVar31 = &decoder_1;
          lVar23 = 9;
          ppVar29 = ppVar20;
          ppVar32 = ppVar31;
          for (lVar25 = lVar23; lVar26 = lVar23, ppVar30 = ppVar19, lVar25 != 0;
              lVar25 = lVar25 + -1) {
            (ppVar32->config).size = *(size_t *)ppVar29;
            ppVar29 = (pt_event *)((long)ppVar29 + (ulong)bVar38 * -0x10 + 8);
            ppVar32 = (pt_packet_decoder *)((long)ppVar32 + (ulong)bVar38 * -0x10 + 8);
          }
          for (; ppVar29 = ppVar19, lVar26 != 0; lVar26 = lVar26 + -1) {
            uVar9 = *(undefined4 *)&ppVar30->field_0x4;
            ppVar20->type = ppVar30->type;
            *(undefined4 *)&ppVar20->field_0x4 = uVar9;
            ppVar30 = (pt_event *)((long)ppVar30 + (ulong)bVar38 * -0x10 + 8);
            ppVar20 = (pt_event *)((long)ppVar20 + (ulong)bVar38 * -0x10 + 8);
          }
          for (; lVar23 != 0; lVar23 = lVar23 + -1) {
            *(size_t *)ppVar29 = (ppVar31->config).size;
            ppVar31 = (pt_packet_decoder *)((long)ppVar31 + (ulong)bVar38 * -0x10 + 8);
            ppVar29 = (pt_event *)((long)ppVar29 + (ulong)bVar38 * -0x10 + 8);
          }
        }
        if (ppVar19->type != ptev_async_branch) {
          return -1;
        }
        decoder->event = ppVar19;
LAB_00106523:
        paVar33 = (anon_union_32_33_0b3fe036_for_variant *)&(ppVar19->variant).async_disabled.ip;
      }
      goto LAB_00106599;
    }
    ppVar19 = pt_evq_dequeue(evq,2);
    if (ppVar19 == (pt_event *)0x0) break;
    decoder->event = ppVar19;
    pVar3 = ppVar19->type;
    if (pVar3 == ptev_tick) {
      decoder->event = (pt_event *)0x0;
      goto switchD_0010512d_caseD_6;
    }
    switch(pVar3) {
    case ptev_async_branch:
      goto switchD_0010696d_caseD_4;
    case ptev_paging:
    case ptev_overflow:
    case ptev_tsx:
    case ptev_stop:
    case ptev_vmcs:
      goto switchD_0010696d_caseD_4;
    case ptev_async_paging:
      lStack_2b0 = 0x38;
      break;
    default:
      if (pVar3 != ptev_iflags) {
        return -6;
      }
    case ptev_exec_mode:
    case ptev_async_vmcs:
      lStack_2b0 = 0x30;
    }
    paVar33 = (anon_union_32_33_0b3fe036_for_variant *)
              ((long)ppVar19->reserved + lStack_2b0 + -0x18);
LAB_00106599:
    iVar18 = pt_evt_event_ip(&(paVar33->disabled).ip,ppVar19,last_ip);
    if (iVar18 < 0) {
      return iVar18;
    }
LAB_001065ad:
    iVar18 = pt_evt_event_time(ppVar19,time_00);
    return iVar18;
  case ppt_tip_pge:
    while( true ) {
      iVar18 = pt_last_ip_update_ip(last_ip,&packet_01->ip,(pt_config *)decoder);
      if (iVar18 < 0) {
        return iVar18;
      }
      if ((decoder->field_0x72c & 0x20) == 0) {
        ppVar19 = pt_evq_standalone(evq);
        decoder->event = ppVar19;
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_enabled;
        iVar18 = pt_evt_event_ip(&(ppVar19->variant).disabled.ip,ppVar19,last_ip);
        if (iVar18 < 0) {
          return iVar18;
        }
        decoder->field_0x72c = decoder->field_0x72c | 0x30;
        goto LAB_001065ad;
      }
      ppVar19 = pt_evq_dequeue(evq,2);
      if (ppVar19 == (pt_event *)0x0) break;
      decoder->event = ppVar19;
      pVar3 = ppVar19->type;
      if (pVar3 != ptev_tick) {
        if ((pVar3 != ptev_exec_mode) && (pVar3 != ptev_iflags)) {
          return -6;
        }
        goto LAB_00106523;
      }
      decoder->event = (pt_event *)0x0;
    }
    break;
  case ppt_tip_pgd:
    iVar18 = pt_last_ip_update_ip(last_ip,&packet_01->ip,(pt_config *)decoder);
    if (iVar18 < 0) {
      return iVar18;
    }
    ppVar19 = pt_evq_dequeue(evq,2);
    if (ppVar19 != (pt_event *)0x0) {
      decoder->event = ppVar19;
      switch(ppVar19->type) {
      case ptev_async_branch:
        ppVar19->type = ptev_async_disabled;
        iVar18 = pt_evt_event_ip(&(ppVar19->variant).async_disabled.ip,ppVar19,last_ip);
        decoder->field_0x72c = decoder->field_0x72c & 0xcf | 0x20;
        if (iVar18 < 0) {
          return iVar18;
        }
        break;
      case ptev_paging:
      case ptev_overflow:
      case ptev_tsx:
      case ptev_stop:
      case ptev_vmcs:
        return -6;
      case ptev_async_paging:
      case ptev_async_vmcs:
        if ((decoder->field_0x72c & 0x20) == 0) {
          return -1;
        }
      case ptev_exec_mode:
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
        break;
      default:
switchD_0010696d_caseD_4:
        return -6;
      }
      goto LAB_001065ad;
    }
    if ((decoder->field_0x72c & 0x20) == 0) {
      ppVar19 = pt_evq_standalone(evq);
      decoder->event = ppVar19;
      if (ppVar19 == (pt_event *)0x0) {
        return -1;
      }
      ppVar19->type = ptev_disabled;
      iVar18 = pt_evt_event_ip(&(ppVar19->variant).disabled.ip,ppVar19,last_ip);
      if (iVar18 < 0) {
        return iVar18;
      }
      iVar18 = pt_evt_event_time(ppVar19,time_00);
      if (iVar18 < 0) {
        return iVar18;
      }
      decoder->field_0x72c = decoder->field_0x72c & 0xef;
      goto LAB_00106af1;
    }
    break;
  case ppt_tnt_8:
  case ppt_tnt_64:
    if ((decoder->field_0x72c & 0x10) == 0) {
      return -6;
    }
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_tnt;
    (ppVar19->variant).enabled.ip = (decoder->packet).payload.tnt.payload;
    (ppVar19->variant).ptwrite.size = (decoder->packet).payload.tnt.bit_size;
    goto LAB_00106add;
  case ppt_mode:
    if ((packet_01->ip).ipc == 0x20) {
      if ((decoder->field_0x72c & 0x10) == 0) {
        ppVar19 = pt_evq_standalone(evq);
        decoder->event = ppVar19;
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_tsx;
        bVar38 = *packet_02;
        bVar22 = (ppVar19->variant).ptwrite.size;
        (ppVar19->variant).ptwrite.size = bVar22 & 0xfe | bVar38 & 1;
        (ppVar19->variant).ptwrite.size = bVar22 & 0xfc | bVar38 & 1 | *packet_02 & 2;
        goto LAB_00106aa5;
      }
      ppVar19 = pt_evq_enqueue(evq,(uint)((*packet_02 & 2) == 0) * 4 + 4);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_tsx;
      bVar27 = *packet_02;
      bVar2 = (ppVar19->variant).ptwrite.size;
      (ppVar19->variant).ptwrite.size = bVar2 & 0xfe | bVar27 & 1;
      bVar22 = *packet_02 & 2;
      bVar27 = bVar2 & 0xfc | bVar27 & 1;
LAB_001058ab:
      (ppVar19->variant).ptwrite.size = bVar27 | bVar22;
    }
    else {
      if ((packet_01->ip).ipc != pt_ipc_suppressed) {
        return -4;
      }
      bVar22 = decoder->field_0x72c;
      if ((((bVar22 & 1) == 0) || (bVar27 = *packet_02, ((bVar22 >> 3 ^ bVar27) & 1) != 0)) ||
         (bVar37 = true, ((bVar27 >> 1 ^ bVar22 >> 2) & 1) != 0)) {
        ppVar19 = pt_evq_enqueue(evq,10);
        if (ppVar19 == (pt_event *)0x0) {
          return -9;
        }
        ppVar19->type = ptev_exec_mode;
        pVar15 = pt_get_exec_mode((pt_packet_mode_exec *)packet_02);
        (ppVar19->variant).exec_mode.mode = pVar15;
        bVar27 = (decoder->packet).payload.cfe.vector;
        bVar22 = bVar27 * '\x02' & 4 | decoder->field_0x72c & 0xf3 | bVar27 * '\b' & 8;
        decoder->field_0x72c = bVar22;
        bVar37 = false;
      }
      if (((undefined1  [16])((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x2) ==
           (undefined1  [16])0x0) ||
         (((bVar22 & 1) != 0 && (((bVar27 >> 2 ^ bVar22 >> 1) & 1) == 0)))) {
        if (bVar37) {
          ppVar19 = pt_evq_enqueue(evq,10);
          if (ppVar19 == (pt_event *)0x0) {
            return -9;
          }
          ppVar19->type = ptev_tick;
          bVar22 = decoder->field_0x72c;
        }
      }
      else {
        ppVar19 = pt_evq_enqueue(evq,10);
        if (ppVar19 == (pt_event *)0x0) {
          return -9;
        }
        ppVar19->type = ptev_iflags;
        (ppVar19->variant).pwre.state =
             (ppVar19->variant).pwre.state & 0xfe | (decoder->packet).payload.cfe.vector >> 2 & 1;
        bVar22 = decoder->field_0x72c & 0xfd | (decoder->packet).payload.cfe.vector >> 1 & 2;
      }
      decoder->field_0x72c = bVar22 | 1;
    }
    break;
  case ppt_pip:
    ppVar19 = pt_evq_find(evq,2,ptev_async_branch);
    if (ppVar19 != (pt_event *)0x0) {
      ppVar19 = pt_evq_enqueue(evq,2);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_async_paging;
      (ppVar19->variant).enabled.ip = (uint64_t)(decoder->packet).payload.mode;
      bVar22 = (decoder->packet).payload.ptw.plc & 1;
      bVar27 = (ppVar19->variant).ptwrite.size & 0xfe;
      goto LAB_001058ab;
    }
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_paging;
    (ppVar19->variant).enabled.ip = (uint64_t)(decoder->packet).payload.mode;
    (ppVar19->variant).ptwrite.size =
         (ppVar19->variant).ptwrite.size & 0xfe | (decoder->packet).payload.ptw.plc & 1;
    goto LAB_00106add;
  case ppt_vmcs:
    ppVar19 = pt_evq_find(evq,2,ptev_async_paging);
    if (ppVar19 == (pt_event *)0x0) {
      ppVar19 = pt_evq_find(evq,2,ptev_async_branch);
      if (ppVar19 == (pt_event *)0x0) {
        ppVar19 = pt_evq_standalone(evq);
        decoder->event = ppVar19;
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_vmcs;
        goto LAB_00106ad1;
      }
      ppVar19 = pt_evq_enqueue(evq,2);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_async_vmcs;
      (ppVar19->variant).disabled.ip = (uint64_t)packet_01->mode;
    }
    else {
      ppVar20 = pt_evq_enqueue(evq,2);
      if (ppVar20 == (pt_event *)0x0) {
        return -9;
      }
      ppVar29 = ppVar19;
      for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
        uVar9 = *(undefined4 *)&ppVar29->field_0x4;
        ppVar20->type = ppVar29->type;
        *(undefined4 *)&ppVar20->field_0x4 = uVar9;
        ppVar29 = (pt_event *)((long)ppVar29 + (ulong)bVar38 * -0x10 + 8);
        ppVar20 = (pt_event *)((long)ppVar20 + (ulong)bVar38 * -0x10 + 8);
      }
      ppVar19->type = ptev_async_vmcs;
      (ppVar19->variant).disabled.ip = (uint64_t)packet_01->mode;
    }
    break;
  case ppt_cbr:
    iVar18 = pt_evt_apply_cbr(time_00,tcal_00,&packet_01->cbr,(pt_config *)decoder);
    if (iVar18 < 0) {
      return iVar18;
    }
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_cbr;
    *(ushort *)&ppVar19->variant = (ushort)(packet_01->tnt).bit_size;
    goto LAB_00106add;
  case ppt_tsc:
    iVar18 = pt_evt_apply_tsc(time_00,tcal_00,&packet_01->tsc,(pt_config *)decoder);
    goto LAB_001057ef;
  case ppt_tma:
    iVar18 = pt_evt_apply_tma(time_00,tcal_00,&packet_01->tma,(pt_config *)decoder);
    goto LAB_001057ef;
  case ppt_mtc:
    iVar18 = pt_evt_apply_mtc(time_00,tcal_00,&packet_01->mtc,(pt_config *)decoder);
    goto LAB_001057ef;
  case ppt_cyc:
    iVar18 = pt_evt_apply_cyc(time_00,tcal_00,&packet_01->cyc,(pt_config *)decoder);
LAB_001057ef:
    if (iVar18 < 0) {
      return iVar18;
    }
    break;
  case ppt_stop:
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_stop;
    goto LAB_00106add;
  case ppt_ovf:
    iVar18 = pt_evt_decode_psbend(decoder);
    if (iVar18 < 1) goto LAB_001063a1;
    uVar4 = time_00->tsc;
    uVar5 = (decoder->time).base;
    uVar6 = (decoder->time).fc;
    uVar12 = (decoder->time).ctc;
    uVar13 = (decoder->time).ctc_cyc;
    uVar28 = (decoder->time).lost_mtc;
    uVar10 = (decoder->time).lost_cyc;
    uVar36 = (decoder->time).cbr;
    uVar11 = *(undefined7 *)&(decoder->time).field_0x29;
    tcal.fcr = tcal_00->fcr;
    tcal.min_fcr = (decoder->tcal).min_fcr;
    tcal.max_fcr = (decoder->tcal).max_fcr;
    tcal.tsc = (decoder->tcal).tsc;
    tcal.cyc_tsc = (decoder->tcal).cyc_tsc;
    tcal.cyc_mtc = (decoder->tcal).cyc_mtc;
    tcal.ctc = (decoder->tcal).ctc;
    tcal.lost_mtc = (decoder->tcal).lost_mtc;
    tcal._56_8_ = *(undefined8 *)&(decoder->tcal).field_0x38;
    pt_evt_reset(decoder);
    (decoder->time).lost_mtc = uVar28;
    (decoder->time).lost_cyc = uVar10;
    (decoder->time).cbr = uVar36;
    *(undefined7 *)&(decoder->time).field_0x29 = uVar11;
    (decoder->time).fc = uVar6;
    (decoder->time).ctc = uVar12;
    (decoder->time).ctc_cyc = uVar13;
    time_00->tsc = uVar4;
    (decoder->time).base = uVar5;
    if ((undefined1  [16])((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      iVar18 = pt_tcal_update_ovf(&tcal,(pt_config *)decoder);
      if (iVar18 < 0) goto LAB_001063a1;
      (decoder->tcal).ctc = tcal.ctc;
      (decoder->tcal).lost_mtc = tcal.lost_mtc;
      *(undefined8 *)&(decoder->tcal).field_0x38 = tcal._56_8_;
      (decoder->tcal).cyc_tsc = tcal.cyc_tsc;
      (decoder->tcal).cyc_mtc = tcal.cyc_mtc;
      (decoder->tcal).max_fcr = tcal.max_fcr;
      (decoder->tcal).tsc = tcal.tsc;
      tcal_00->fcr = tcal.fcr;
      (decoder->tcal).min_fcr = tcal.min_fcr;
    }
    memcpy(&decoder_1,decoder,0x128);
    uVar35 = 0;
    do {
      do {
        iVar16 = pt_pkt_next(&decoder_1,(pt_packet *)&tcal_1,0x18);
        if (iVar16 < 0) {
LAB_00105dda:
          if ((undefined1  [64])
              ((undefined1  [64])(decoder->pacdec).config.errata & (undefined1  [64])0x10) ==
              (undefined1  [64])0x0) goto switchD_00106040_caseD_0;
          memcpy(&decoder_1,decoder,0x128);
          time.tsc = time_00->tsc;
          time.base = (decoder->time).base;
          time.fc = (decoder->time).fc;
          time.ctc = (decoder->time).ctc;
          time.ctc_cyc = (decoder->time).ctc_cyc;
          time.lost_mtc = (decoder->time).lost_mtc;
          time.lost_cyc = (decoder->time).lost_cyc;
          time.cbr = (decoder->time).cbr;
          time._41_7_ = *(undefined7 *)&(decoder->time).field_0x29;
          tcal_1.fcr = tcal_00->fcr;
          tcal_1.min_fcr = (decoder->tcal).min_fcr;
          tcal_1.max_fcr = (decoder->tcal).max_fcr;
          tcal_1.tsc = (decoder->tcal).tsc;
          tcal_1.cyc_tsc = (decoder->tcal).cyc_tsc;
          tcal_1.cyc_mtc = (decoder->tcal).cyc_mtc;
          tcal_1.ctc = (decoder->tcal).ctc;
          tcal_1.lost_mtc = (decoder->tcal).lost_mtc;
          tcal_1._56_8_ = *(undefined8 *)&(decoder->tcal).field_0x38;
          bVar22 = 0;
          goto switchD_00106040_caseD_2;
        }
        if (tcal_1.fcr._4_1_ == 0) {
          iVar16 = -5;
          goto LAB_00105dda;
        }
        uVar35 = uVar35 + tcal_1.fcr._4_1_;
      } while (0x1c < (uint)tcal_1.fcr);
      if ((0x1fd83888U >> ((uint)tcal_1.fcr & 0x1f) & 1) != 0) {
        iVar16 = 0;
        goto LAB_00105dda;
      }
      if ((0x750U >> ((uint)tcal_1.fcr & 0x1f) & 1) != 0) {
        iVar16 = -6;
        goto LAB_00105dda;
      }
    } while ((uint)tcal_1.fcr != 5);
    if ((undefined1  [64])
        ((undefined1  [64])(decoder->pacdec).config.errata & (undefined1  [64])0x40) ==
        (undefined1  [64])0x0) {
LAB_001056c3:
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) goto LAB_00106442;
      ppVar19->type = ptev_overflow;
      iVar16 = pt_evt_event_time(ppVar19,time_00);
      iVar18 = iVar14;
      if (iVar16 < 0) {
        iVar18 = iVar16;
      }
      goto LAB_001063a1;
    }
    uVar34 = (ulong)uVar35;
    memcpy(&decoder_1,decoder,0x128);
    decoder_1.pos = decoder_1.pos + uVar34;
    if (decoder_1.pos <= decoder_1.config.end) {
      do {
        do {
          iVar18 = pt_pkt_next(&decoder_1,(pt_packet *)&tcal_1,0x18);
          if (iVar18 < 0) {
            if (iVar18 == -7) goto LAB_001056c3;
            goto LAB_001063a1;
          }
        } while (0x14 < (uint)tcal_1.fcr);
        if ((0x100753U >> ((uint)tcal_1.fcr & 0x1f) & 1) != 0) goto LAB_001056c3;
        if ((0x80080U >> ((uint)tcal_1.fcr & 0x1f) & 1) != 0) goto LAB_00106248;
      } while ((uint)tcal_1.fcr != 3);
      iVar18 = pt_evt_find_header_fup((pt_packet *)&tcal_1,&decoder_1);
      if (iVar18 != -7) {
        if (iVar18 == 0) {
LAB_00106248:
          do {
            iVar18 = pt_pkt_next(&decoder->pacdec,packet_00,0x18);
            if (iVar18 < 0) goto LAB_001063a1;
            uVar21 = (ulong)(decoder->packet).size;
            bVar37 = uVar34 < uVar21;
            uVar34 = uVar34 - uVar21;
            if (bVar37 || uVar34 == 0) {
              iVar18 = -1;
              if (!bVar37) {
                ppVar19 = pt_evq_standalone(evq);
                decoder->event = ppVar19;
                if (ppVar19 != (pt_event *)0x0) goto LAB_00105f74;
              }
              goto LAB_001063a1;
            }
            switch(packet_00->type) {
            case ppt_invalid:
            case ppt_unknown:
            case ppt_mode:
            case ppt_pip:
            case ppt_vmcs:
              goto switchD_00106291_caseD_0;
            case ppt_cbr:
              iVar18 = pt_evt_apply_cbr(time_00,tcal_00,&packet_01->cbr,(pt_config *)decoder);
              break;
            case ppt_tsc:
              iVar18 = pt_evt_apply_tsc(time_00,tcal_00,&packet_01->tsc,(pt_config *)decoder);
              break;
            case ppt_tma:
              iVar18 = pt_evt_apply_tma(time_00,tcal_00,&packet_01->tma,(pt_config *)decoder);
              break;
            case ppt_mtc:
              iVar18 = pt_evt_apply_mtc(time_00,tcal_00,&packet_01->mtc,(pt_config *)decoder);
              break;
            case ppt_cyc:
              iVar18 = pt_evt_apply_cyc(time_00,tcal_00,&packet_01->cyc,(pt_config *)decoder);
            }
            if (iVar18 < 0) goto LAB_001063a1;
          } while( true );
        }
        if (iVar18 < 1) goto LAB_001063a1;
      }
      goto LAB_001056c3;
    }
    goto switchD_00106291_caseD_0;
  case ppt_mnt:
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_mnt;
LAB_00106ad1:
    (ppVar19->variant).disabled.ip = (uint64_t)packet_01->mode;
    goto LAB_00106add;
  case ppt_exstop:
    ppVar19 = pt_evq_dequeue(evq,0x10);
    if (ppVar19 != (pt_event *)0x0) {
      if (ppVar19->type != ptev_mwait) {
        return -1;
      }
      if (((packet_01->tnt).bit_size & 1) == 0) {
        (ppVar19->variant).enabled.ip = 0;
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
        decoder->event = ppVar19;
        goto LAB_001065ad;
      }
      ppVar20 = pt_evq_enqueue(evq,8);
      if (ppVar20 == (pt_event *)0x0) {
        return -9;
      }
      for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
        uVar9 = *(undefined4 *)&ppVar19->field_0x4;
        ppVar20->type = ppVar19->type;
        *(undefined4 *)&ppVar20->field_0x4 = uVar9;
        ppVar19 = (pt_event *)((long)ppVar19 + (ulong)bVar38 * -0x10 + 8);
        ppVar20 = (pt_event *)((long)ppVar20 + (ulong)bVar38 * -0x10 + 8);
      }
    }
    if (((packet_01->tnt).bit_size & 1) == 0) {
      ppVar19 = pt_evq_standalone(evq);
      decoder->event = ppVar19;
      if (ppVar19 == (pt_event *)0x0) {
        return -1;
      }
      ppVar19->type = ptev_exstop;
LAB_00106aa5:
      (ppVar19->variant).enabled.ip = 0;
      ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
      goto LAB_00106add;
    }
    ppVar19 = pt_evq_enqueue(evq,8);
    if (ppVar19 == (pt_event *)0x0) {
      return -9;
    }
    ppVar19->type = ptev_exstop;
    break;
  case ppt_mwait:
    ppVar19 = pt_evq_enqueue(evq,0x10);
    if (ppVar19 == (pt_event *)0x0) {
      return -9;
    }
    ppVar19->type = ptev_mwait;
    (ppVar19->variant).mwait.hints = (packet_01->ip).ipc;
    (ppVar19->variant).mwait.ext = *(uint32_t *)packet_02;
    break;
  case ppt_pwre:
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_pwre;
    (ppVar19->variant).pwre.state = (decoder->packet).payload.tnt.bit_size;
    (ppVar19->variant).pwre.sub_state = (decoder->packet).payload.pwre.sub_state;
    if ((undefined1  [16])((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000)
        != (undefined1  [16])0x0) {
      pbVar1 = (byte *)((long)&ppVar19->variant + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    goto LAB_00106add;
  case ppt_pwrx:
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
      return -1;
    }
    ppVar19->type = ptev_pwrx;
    (ppVar19->variant).pwre.state = (decoder->packet).payload.tnt.bit_size;
    (ppVar19->variant).pwre.sub_state = (decoder->packet).payload.pwre.sub_state;
    bVar38 = *(byte *)((long)&(decoder->packet).payload + 2);
    if ((bVar38 & 1) != 0) {
      pbVar1 = (byte *)((long)&ppVar19->variant + 2);
      *pbVar1 = *pbVar1 | 1;
      bVar38 = *(byte *)((long)&(decoder->packet).payload + 2);
    }
    if ((bVar38 & 2) != 0) {
      pbVar1 = (byte *)((long)&ppVar19->variant + 2);
      *pbVar1 = *pbVar1 | 2;
      bVar38 = *(byte *)((long)&(decoder->packet).payload + 2);
    }
    if ((bVar38 & 4) != 0) {
      pbVar1 = (byte *)((long)&ppVar19->variant + 2);
      *pbVar1 = *pbVar1 | 4;
    }
LAB_00106add:
    iVar18 = pt_evt_event_time(ppVar19,time_00);
    if (iVar18 < 0) {
      return iVar18;
    }
LAB_00106af1:
    pt_evt_fetch_packet(decoder);
    return 0;
  case ppt_ptw:
    bVar22 = (decoder->packet).payload.ptw.plc;
    uVar36 = '\x04';
    if (bVar22 != 0) {
      if (bVar22 != 1) {
        if (bVar22 - 2 < 2) {
          return -5;
        }
        return -1;
      }
      uVar36 = '\b';
    }
    if ((undefined1  [16])((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x100) ==
        (undefined1  [16])0x0) {
      ppVar19 = pt_evq_standalone(evq);
      decoder->event = ppVar19;
      if (ppVar19 == (pt_event *)0x0) {
        return -1;
      }
      ppVar19->type = ptev_ptwrite;
      (ppVar19->variant).ptwrite.size = uVar36;
      (ppVar19->variant).async_paging.ip = (uint64_t)packet_01->mode;
      goto LAB_00106aa5;
    }
    ppVar19 = pt_evq_enqueue(evq,8);
    if (ppVar19 == (pt_event *)0x0) {
      return -9;
    }
    ppVar19->type = ptev_ptwrite;
    (ppVar19->variant).ptwrite.size = uVar36;
    pVar24 = packet_01->mode;
LAB_001059dd:
    (ppVar19->variant).async_paging.ip = (uint64_t)pVar24;
    break;
  case ppt_cfe:
    ppVar19 = pt_evq_dequeue(evq,0x20);
    pVar17 = (packet_01->ip).ipc;
    switch(pVar17) {
    case pt_ipc_update_16:
      if (ppVar19 == (pt_event *)0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_interrupt;
      }
      else if (ppVar19->type != ptev_interrupt) {
        return -6;
      }
      (ppVar19->variant).pwre.sub_state = (decoder->packet).payload.cfe.vector;
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        if ((decoder->field_0x72c & 0x10) != 0) goto LAB_00106182;
LAB_00106b3a:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
LAB_00106cb6:
        decoder->event = ppVar19;
        goto LAB_00106af1;
      }
      uVar28 = 8;
      goto LAB_00106185;
    case pt_ipc_update_32:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_iret;
LAB_00106c9d:
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
LAB_00106ca2:
        iVar18 = pt_evt_event_time(ppVar19,time_00);
        if (iVar18 < 0) {
          return iVar18;
        }
        goto LAB_00106cb6;
      }
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_iret;
      break;
    case pt_ipc_sext_48:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        if ((decoder->field_0x72c & 0x10) == 0) {
          ppVar19 = pt_evq_standalone(evq);
          if (ppVar19 == (pt_event *)0x0) {
            return -1;
          }
          ppVar19->type = ptev_smi;
          goto LAB_00106c9d;
        }
        uVar28 = 4;
      }
      else {
        uVar28 = 8;
      }
      ppVar19 = pt_evq_enqueue(evq,uVar28);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_smi;
      break;
    case pt_ipc_update_48:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) !=
          (undefined1  [16])0x0) {
        return -5;
      }
      if ((decoder->field_0x72c & 0x10) == 0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
        ppVar19->type = ptev_rsm;
        goto LAB_00106ca2;
      }
      ppVar19 = pt_evq_enqueue(evq,4);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
      ppVar19->type = ptev_rsm;
      break;
    case pt_ipc_update_48|pt_ipc_update_16:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) !=
          (undefined1  [16])0x0) {
        return -5;
      }
      if ((decoder->field_0x72c & 0x10) == 0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
        ppVar19->type = ptev_sipi;
        (ppVar19->variant).pwre.state = *packet_02;
        goto LAB_00106ca2;
      }
      ppVar19 = pt_evq_enqueue(evq,4);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
      ppVar19->type = ptev_sipi;
      goto LAB_00105d7c;
    case pt_ipc_full:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        if ((decoder->field_0x72c & 0x10) == 0) {
          ppVar19 = pt_evq_standalone(evq);
          if (ppVar19 == (pt_event *)0x0) {
            return -1;
          }
          ppVar19->type = ptev_init;
          goto LAB_00106c9d;
        }
        uVar28 = 4;
      }
      else {
        uVar28 = 8;
      }
      ppVar19 = pt_evq_enqueue(evq,uVar28);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_init;
      break;
    case pt_ipc_full|pt_ipc_update_16:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_vmentry;
        goto LAB_00106c9d;
      }
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_vmentry;
      break;
    case 8:
    case 9:
      if (ppVar19 == (pt_event *)0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_vmexit;
        pVar17 = (packet_01->ip).ipc;
      }
      else if (ppVar19->type != ptev_vmexit) {
        return -6;
      }
      if (pVar17 == 9) {
        (ppVar19->variant).pwre.state = (ppVar19->variant).pwre.state | 1;
        (ppVar19->variant).pwre.sub_state = *packet_02;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        if ((decoder->field_0x72c & 0x10) == 0) goto LAB_00106b3a;
LAB_00106182:
        uVar28 = 4;
      }
      else {
        uVar28 = 8;
      }
LAB_00106185:
      ppVar19 = pt_evq_requeue(evq,ppVar19,uVar28);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      break;
    case 10:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_shutdown;
        goto LAB_00106c9d;
      }
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_shutdown;
      break;
    default:
      if (ppVar19 != (pt_event *)0x0) {
switchD_0010696d_caseD_4:
        return -1;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) !=
          (undefined1  [16])0x0) {
        ppVar19 = pt_evq_enqueue(evq,8);
        if (ppVar19 == (pt_event *)0x0) {
          return -9;
        }
        ppVar19->type = ptev_tick;
      }
      break;
    case 0xc:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        if ((decoder->field_0x72c & 0x10) == 0) {
          ppVar19 = pt_evq_standalone(evq);
          if (ppVar19 == (pt_event *)0x0) {
            return -1;
          }
          ppVar19->type = ptev_uintr;
          (ppVar19->variant).pwre.state = *packet_02;
          goto LAB_00106c9d;
        }
        uVar28 = 4;
      }
      else {
        uVar28 = 8;
      }
      ppVar19 = pt_evq_enqueue(evq,uVar28);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_uintr;
LAB_00105d7c:
      (ppVar19->variant).pwre.state = *packet_02;
      break;
    case 0xd:
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      if ((undefined1  [16])
          ((undefined1  [16])(decoder->packet).payload & (undefined1  [16])0x10000000000) ==
          (undefined1  [16])0x0) {
        ppVar19 = pt_evq_standalone(evq);
        if (ppVar19 == (pt_event *)0x0) {
          return -1;
        }
        ppVar19->type = ptev_uiret;
        goto LAB_00106c9d;
      }
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_uiret;
    }
    break;
  case ppt_evd:
    ppVar19 = pt_evq_peek(evq,0x20);
    pVar17 = (packet_01->ip).ipc;
    if (pVar17 == pt_ipc_update_32) {
      if (ppVar19 == (pt_event *)0x0) {
        ppVar19 = pt_evq_enqueue(evq,0x20);
        if (ppVar19 == (pt_event *)0x0) {
          return -9;
        }
        ppVar19->type = ptev_vmexit;
      }
      else if (ppVar19->type != ptev_vmexit) {
        return -6;
      }
      bVar22 = (ppVar19->variant).pwre.state;
      if ((bVar22 & 2) != 0) {
        return -6;
      }
      (ppVar19->variant).pwre.state = bVar22 | 2;
    }
    else {
      if (pVar17 == pt_ipc_update_16) {
        if (ppVar19 == (pt_event *)0x0) {
          ppVar19 = pt_evq_enqueue(evq,0x20);
          if (ppVar19 == (pt_event *)0x0) {
            return -9;
          }
          ppVar19->type = ptev_vmexit;
        }
        else if (ppVar19->type != ptev_vmexit) {
          return -6;
        }
        bVar22 = (ppVar19->variant).pwre.state;
        if ((bVar22 & 4) != 0) {
          return -6;
        }
        (ppVar19->variant).pwre.state = bVar22 | 4;
        pVar24 = (pt_packet_mode)(decoder->packet).payload.tnt.payload;
        goto LAB_001059dd;
      }
      if (pVar17 != pt_ipc_suppressed) break;
      if (ppVar19 != (pt_event *)0x0) {
        return -6;
      }
      ppVar19 = pt_evq_enqueue(evq,0x20);
      if (ppVar19 == (pt_event *)0x0) {
        return -9;
      }
      ppVar19->type = ptev_interrupt;
      (ppVar19->variant).pwre.state = (ppVar19->variant).pwre.state | 1;
    }
    (ppVar19->variant).async_disabled.ip = (decoder->packet).payload.tnt.payload;
    break;
  default:
    return -4;
  }
switchD_0010512d_caseD_1:
  if (decoder->event != (pt_event *)0x0) {
    return -1;
  }
  decoder->field_0x72c = decoder->field_0x72c & 0xdf;
  pt_evt_fetch_packet(decoder);
  goto LAB_00105103;
switchD_00106040_caseD_2:
  iVar18 = pt_pkt_next(&decoder_1,&packet,0x18);
  if (-1 < iVar18) goto code_r0x00106032;
  goto LAB_00106396;
code_r0x00106032:
  switch(packet.type) {
  case ppt_invalid:
  case ppt_unknown:
  case ppt_tip_pge:
  case ppt_tnt_8:
  case ppt_tnt_64:
  case ppt_stop:
  case ppt_ovf:
  case ppt_mwait:
    goto switchD_00106040_caseD_0;
  default:
    goto switchD_00106040_caseD_2;
  case ppt_psb:
    iVar18 = pt_evt_find_header_fup(&local_170,&decoder_1);
    if (iVar18 < 0) {
LAB_00106396:
      if (iVar18 != -7) goto LAB_001063a1;
      goto switchD_00106040_caseD_0;
    }
    if (iVar18 == 0) goto switchD_00106040_caseD_0;
    if (local_170.type != ppt_fup) {
      iVar18 = -1;
      goto LAB_001063a1;
    }
    ppVar7 = &local_170;
    goto LAB_00106438;
  case ppt_psbend:
    iVar18 = -6;
    goto LAB_001063a1;
  case ppt_fup:
    (decoder->packet).payload.tnt.payload =
         CONCAT62(packet.payload.tnt.payload._2_6_,
                  CONCAT11(packet.payload.tnt.payload._1_1_,packet.payload.ptw.plc));
    pVar24.bits._0_1_ = packet.payload.cfe.vector;
    pVar24.leaf = packet.payload.ip.ipc;
    pVar24.bits._1_1_ = packet.payload.pip.cr3._5_1_;
    pVar24.bits._2_2_ = packet.payload.pip.cr3._6_2_;
    packet_00->type = packet.type;
    packet_00->size = packet.size;
    *(int3 *)&packet_00->field_0x5 = packet._5_3_;
    (decoder->packet).payload.mode = pVar24;
    if ((bVar22 & 1) != 0) {
      ppVar19 = pt_evq_enqueue(evq,8);
      if (ppVar19 == (pt_event *)0x0) goto LAB_00106442;
      ppVar19->type = ptev_tsx;
      (ppVar19->variant).ptwrite.size = bVar22 >> 1 & 3 | (ppVar19->variant).ptwrite.size & 0xfc;
    }
    ppVar7 = &packet;
LAB_00106438:
    iVar18 = pt_evt_recover_ovf_at_ip
                       (decoder,&decoder_1,&packet,&(ppVar7->payload).ip,&time,&tcal_1);
    goto LAB_001063a1;
  case ppt_tip:
    iVar18 = pt_evt_recover_ovf_at_ip(decoder,&decoder_1,&packet,&packet.payload.ip,&time,&tcal_1);
    goto LAB_00105f8a;
  case ppt_tip_pgd:
    iVar18 = pt_evt_recover_ovf_disabled(decoder,&decoder_1,&packet,&time,&tcal_1);
    goto LAB_00105f8a;
  case ppt_mode:
    if (packet.payload.ip.ipc == 0x20) {
      if ((bVar22 & 1) != 0) goto switchD_00106040_caseD_0;
      bVar22 = packet.payload.cfe.vector * '\x02' + 1;
    }
    goto switchD_00106040_caseD_2;
  case ppt_cbr:
    iVar18 = pt_evt_apply_cbr(&time,&tcal_1,&packet.payload.cbr,&decoder_1.config);
    break;
  case ppt_tsc:
    iVar18 = pt_evt_apply_tsc(&time,&tcal_1,&packet.payload.tsc,&decoder_1.config);
    break;
  case ppt_tma:
    iVar18 = pt_evt_apply_tma(&time,&tcal_1,&packet.payload.tma,&decoder_1.config);
    break;
  case ppt_mtc:
    iVar18 = pt_evt_apply_mtc(&time,&tcal_1,&packet.payload.mtc,&decoder_1.config);
    break;
  case ppt_cyc:
    iVar18 = pt_evt_apply_cyc(&time,&tcal_1,&packet.payload.cyc,&decoder_1.config);
    break;
  case ppt_exstop:
    if ((packet.payload.ip.ipc & pt_ipc_update_16) != pt_ipc_suppressed)
    goto switchD_00106040_caseD_0;
    goto switchD_00106040_caseD_2;
  case ppt_ptw:
    uVar8 = packet.payload.tnt.payload._1_1_;
    goto joined_r0x00106138;
  case ppt_cfe:
    uVar8 = packet.payload.pip.cr3._5_1_;
joined_r0x00106138:
    if ((uVar8 & 1) != 0) goto switchD_00106040_caseD_0;
    goto switchD_00106040_caseD_2;
  }
  if (iVar18 < 0) goto LAB_001063a1;
  goto switchD_00106040_caseD_2;
switchD_00106040_caseD_0:
  if ((iVar16 == -6) &&
     ((undefined1  [64])((undefined1  [64])(decoder->pacdec).config.errata & (undefined1  [64])0x80)
      != (undefined1  [64])0x0)) {
    memcpy(&decoder_1,decoder,0x128);
    time.tsc = time_00->tsc;
    time.base = (decoder->time).base;
    time.fc = (decoder->time).fc;
    time.ctc = (decoder->time).ctc;
    time.ctc_cyc = (decoder->time).ctc_cyc;
    time.lost_mtc = (decoder->time).lost_mtc;
    time.lost_cyc = (decoder->time).lost_cyc;
    time.cbr = (decoder->time).cbr;
    time._41_7_ = *(undefined7 *)&(decoder->time).field_0x29;
    tcal_1.fcr = tcal_00->fcr;
    tcal_1.min_fcr = (decoder->tcal).min_fcr;
    tcal_1.max_fcr = (decoder->tcal).max_fcr;
    tcal_1.tsc = (decoder->tcal).tsc;
    tcal_1.cyc_tsc = (decoder->tcal).cyc_tsc;
    tcal_1.cyc_mtc = (decoder->tcal).cyc_mtc;
    tcal_1.ctc = (decoder->tcal).ctc;
    tcal_1.lost_mtc = (decoder->tcal).lost_mtc;
    tcal_1._56_8_ = *(undefined8 *)&(decoder->tcal).field_0x38;
switchD_00105e98_caseD_2:
    iVar18 = pt_pkt_next(&decoder_1,&packet,0x18);
    if (iVar18 < 0) goto LAB_001063a1;
    switch(packet.type) {
    case ppt_invalid:
    case ppt_unknown:
    case ppt_psb:
    case ppt_psbend:
    case ppt_fup:
    case ppt_tip:
    case ppt_tip_pge:
    case ppt_tnt_8:
    case ppt_tnt_64:
    case ppt_mode:
    case ppt_pip:
    case ppt_vmcs:
    case ppt_stop:
    case ppt_ovf:
    case ppt_exstop:
    case ppt_mwait:
    case ppt_pwre:
    case ppt_pwrx:
    case ppt_ptw:
      goto switchD_00105e98_caseD_0;
    default:
      goto switchD_00105e98_caseD_2;
    case ppt_tip_pgd:
      pt_evt_recover_ovf_disabled(decoder,&decoder_1,&packet,&time,&tcal_1);
      goto LAB_00105f92;
    case ppt_cbr:
      iVar18 = pt_evt_apply_cbr(&time,&tcal_1,&packet.payload.cbr,&decoder_1.config);
      break;
    case ppt_tsc:
      iVar18 = pt_evt_apply_tsc(&time,&tcal_1,&packet.payload.tsc,&decoder_1.config);
      break;
    case ppt_tma:
      iVar18 = pt_evt_apply_tma(&time,&tcal_1,&packet.payload.tma,&decoder_1.config);
      break;
    case ppt_mtc:
      iVar18 = pt_evt_apply_mtc(&time,&tcal_1,&packet.payload.mtc,&decoder_1.config);
      break;
    case ppt_cyc:
      iVar18 = pt_evt_apply_cyc(&time,&tcal_1,&packet.payload.cyc,&decoder_1.config);
    }
    if (iVar18 < 0) goto LAB_001063a1;
    goto switchD_00105e98_caseD_2;
  }
switchD_00105e98_caseD_0:
  if ((iVar16 == 0) || (iVar18 = iVar16, iVar16 == -7)) {
    ppVar19 = pt_evq_standalone(evq);
    decoder->event = ppVar19;
    if (ppVar19 == (pt_event *)0x0) {
switchD_00106291_caseD_0:
      iVar18 = -1;
    }
    else {
LAB_00105f74:
      ppVar19->type = ptev_overflow;
      ppVar19->field_0x4 = ppVar19->field_0x4 | 1;
      iVar18 = pt_evt_event_time(ppVar19,time_00);
LAB_00105f8a:
      if (-1 < iVar18) {
LAB_00105f92:
        pt_evt_fetch_packet(decoder);
        iVar18 = 0;
      }
    }
  }
LAB_001063a1:
  if (iVar18 < 1) {
    return iVar18;
  }
  goto switchD_0010512d_caseD_1;
switchD_0010527c_caseD_11:
  decoder->event = (pt_event *)0x0;
  goto switchD_0010512d_caseD_5;
switchD_0010512d_caseD_3:
  iVar18 = pt_evt_decode_psb(decoder);
  if (iVar18 < 1) {
switchD_0010696d_caseD_4:
    return iVar18;
  }
  goto LAB_00105103;
}

Assistant:

static int pt_evt_fetch_event(struct pt_event_decoder *decoder)
{
	int errcode;

	if (!decoder)
		return -pte_internal;

	for (;;) {
		errcode = pt_evt_decode_packet(decoder);
		if (errcode <= 0)
			break;

		if (decoder->event) {
			errcode = -pte_internal;
			break;
		}

		/* The packet decoder asked for a new packet without delivering
		 * an event.  That new packet isn't bound.
		 *
		 * All flows involving bound packets must take this path since
		 * returning with zero, e.g. via pt_evt_fetch_packet(), without
		 * an event will be diagnosed by our caller.
		 */
		decoder->bound = 0;

		errcode = pt_evt_fetch_packet(decoder);
		if (errcode < 0)
			break;
	}

	return errcode;
}